

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_hatch.cpp
# Opt level: O0

bool __thiscall ON_HatchLoop::SetCurve(ON_HatchLoop *this,ON_Curve *curve)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  ON_Curve *pC;
  ON_Curve *curve_local;
  ON_HatchLoop *this_local;
  ON_Curve *pOVar3;
  
  iVar1 = (*(curve->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x24])();
  pOVar3 = (ON_Curve *)CONCAT44(extraout_var,iVar1);
  if (pOVar3 != (ON_Curve *)0x0) {
    iVar1 = (*(pOVar3->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x18])();
    if ((iVar1 == 3) &&
       (uVar2 = (*(pOVar3->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x28])(pOVar3,2),
       (uVar2 & 1) == 0)) {
      return false;
    }
    if ((this->m_p2dCurve != (ON_Curve *)0x0) && (this->m_p2dCurve != (ON_Curve *)0x0)) {
      (*(this->m_p2dCurve->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])();
    }
    this->m_p2dCurve = pOVar3;
  }
  return true;
}

Assistant:

bool ON_HatchLoop::SetCurve( const ON_Curve& curve)
{
  ON_Curve* pC = curve.DuplicateCurve();
  if( pC)
  {
    if(pC->Dimension() == 3 && !pC->ChangeDimension(2))
      return false;

    if( m_p2dCurve)
      delete m_p2dCurve;
    m_p2dCurve = pC;
  }
  return true;
}